

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_string_cat3(sexp ctx,char *pre,char *mid,char *suf)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  sexp psVar4;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  uchar *__dest;
  sexp str;
  char *s;
  sexp_sint_t in_stack_00000018;
  int slen;
  int mlen;
  int plen;
  
  sVar2 = strlen(in_RSI);
  iVar1 = (int)sVar2;
  sVar2 = strlen(in_RDX);
  sVar3 = strlen(in_RCX);
  psVar4 = sexp_make_string_op((sexp)suf,_mlen,in_stack_00000018,(sexp)s,str);
  __dest = &(((psVar4->value).type.name)->value).uvector.element_type +
           (long)(psVar4->value).type.cpl;
  memcpy(__dest,in_RSI,(long)iVar1);
  memcpy(__dest + iVar1,in_RDX,(long)(int)sVar2);
  memcpy(__dest + (long)(int)sVar2 + (long)iVar1,in_RCX,(long)(int)sVar3);
  return psVar4;
}

Assistant:

sexp sexp_string_cat3 (sexp ctx, const char *pre, const char *mid, const char* suf) {
  int plen=strlen(pre), mlen=strlen(mid), slen=strlen(suf);
  char *s;
  sexp str;
  str = sexp_make_string(ctx, sexp_make_fixnum(plen+mlen+slen), SEXP_VOID);
  memcpy(s=sexp_string_data(str), pre, plen);
  memcpy(s+plen, mid, mlen);
  memcpy(s+plen+mlen, suf, slen);
  return str;
}